

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O0

void CompareOnTheFly(comparer_context *comp)

{
  bool bVar1;
  Chunk *pCVar2;
  undefined1 local_40 [8];
  sliced_chunk_iterator it;
  sliced_chunk_reader reader;
  comparer_context *comp_local;
  
  sliced_chunk_reader::sliced_chunk_reader((sliced_chunk_reader *)&it.end,comp);
  sliced_chunk_reader::begin((sliced_chunk_iterator *)local_40,(sliced_chunk_reader *)&it.end);
  do {
    bVar1 = sliced_chunk_iterator::is_end((sliced_chunk_iterator *)local_40);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_003f54c4:
      sliced_chunk_iterator::~sliced_chunk_iterator((sliced_chunk_iterator *)local_40);
      sliced_chunk_reader::~sliced_chunk_reader((sliced_chunk_reader *)&it.end);
      return;
    }
    pCVar2 = sliced_chunk_iterator::operator*((sliced_chunk_iterator *)local_40);
    if (pCVar2->first == 0x1239) {
      CompareOnTheFlyScene(comp);
      goto LAB_003f54c4;
    }
    sliced_chunk_iterator::operator++((sliced_chunk_iterator *)local_40);
  } while( true );
}

Assistant:

void CompareOnTheFly(comparer_context& comp)
{
    sliced_chunk_reader reader(comp);
    for(sliced_chunk_iterator it = reader.begin(); !it.is_end(); ++it) {
        if ((*it).first == ASSBIN_CHUNK_AISCENE) {
            CompareOnTheFlyScene(comp);
            break;
        }
    }
}